

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fltnode.c
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  bool_t bVar2;
  prf_model_t *model;
  bfile_t *bfile;
  prf_cb_t callback;
  
  if (argc == 3) {
    iVar1 = atoi(argv[1]);
    position = (long)iVar1;
    prf_init();
    model = prf_model_create();
    prf_model_poolmem(model);
    bfile = bf_create_r(argv[2]);
    if (bfile == (bfile_t *)0x0) {
      printf("Error: Could not open \'%s\' for loading.\n",argv[2]);
    }
    else {
      callback.data = bfile;
      callback.func = ::callback;
      bVar2 = prf_model_load_with_callback(model,bfile,callback);
      if (bVar2 != 0) {
        bf_destroy(bfile);
        prf_model_destroy(model);
        prf_exit();
        return 0;
      }
      puts("Error: Couldn\'t parse model.");
      prf_model_destroy(model);
      bf_destroy(bfile);
    }
    prf_exit();
  }
  else {
    printf("Usage: %s <pos> <inputfile>\n",*argv);
  }
  return -1;
}

Assistant:

int main(int argc, char ** argv )
{
  prf_model_t * model;
  bfile_t * file;
  prf_cb_t loadCB;

  if ( argc != 3 ) {
    printf( "Usage: %s <pos> <inputfile>\n", argv[0] );
    return -1;
  }

  position = atoi( argv[1] );

  prf_init();

  model = prf_model_create();
  prf_model_poolmem( model );

  file = bf_create_r( argv[2] );
  if ( ! file ) {
    printf( "Error: Could not open '%s' for loading.\n", argv[2] );
    prf_exit();
    return -1;
  }

  prf_cb_set( loadCB, callback, file );

  if ( ! prf_model_load_with_callback( model, file, loadCB ) ) {
    printf( "Error: Couldn't parse model.\n" );
    prf_model_destroy( model );
    bf_destroy( file );
    prf_exit();
    return -1;
  }
  bf_destroy( file );

  prf_model_destroy( model );
  prf_exit();

  return 0;
}